

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void get_2d_footprint_cells
               (vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *polygon,
               set<sbpl_2Dcell_t,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_> *cells,
               sbpl_xy_theta_pt_t pose,double res)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  int iVar9;
  size_type sVar10;
  reference pvVar11;
  ulong uVar12;
  void *pvVar13;
  reference pvVar14;
  int iVar15;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_RSI;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *in_RDI;
  double in_XMM0_Qa;
  pair<std::_Rb_tree_const_iterator<sbpl_2Dcell_t>,_bool> pVar16;
  double in_stack_00000008;
  double in_stack_00000010;
  double in_stack_00000018;
  int j_1;
  int i_4;
  int i_3;
  sbpl_bfs_2d bfs;
  int tempx;
  int tempy;
  int last_error;
  int x;
  int y;
  int ystep;
  int error;
  int deltay;
  int deltax;
  int temp_1;
  int temp;
  bool steep;
  int y1;
  int x1;
  int y0;
  int x0;
  uint i_2;
  int j;
  int i_1;
  int **grid;
  int sizey;
  int sizex;
  double cy;
  double cx;
  pair<int,_int> p;
  uint i;
  int maxy;
  int miny;
  int maxx;
  int minx;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> disc_polygon;
  double sth;
  double cth;
  sbpl_2Dcell_t cell;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  value_type *in_stack_fffffffffffffd48;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  set<sbpl_2Dcell_t,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_>
  *in_stack_fffffffffffffd60;
  set<sbpl_2Dcell_t,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_> *this;
  size_type in_stack_fffffffffffffd68;
  undefined7 in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd77;
  double local_210;
  double local_208;
  int local_1c0;
  int local_1bc;
  sbpl_2Dcell_t local_194;
  uint local_18c;
  uint local_188;
  int local_184;
  sbpl_bfs_2d local_180;
  _Base_ptr local_150;
  undefined1 local_148;
  sbpl_2Dcell_t local_140;
  _Base_ptr local_138;
  undefined1 local_130;
  sbpl_2Dcell_t local_124;
  int local_11c;
  int local_118;
  int local_114;
  _Base_ptr local_110;
  undefined1 local_108;
  sbpl_2Dcell_t local_100;
  _Base_ptr local_f8;
  undefined1 local_f0;
  sbpl_2Dcell_t local_e8;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  byte local_bd;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  uint local_ac;
  int local_a8;
  int local_a4;
  set<sbpl_2Dcell_t,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_> *local_a0;
  int local_98;
  int local_94;
  double local_90;
  double local_88;
  pair<int,_int> local_80;
  uint local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_58;
  double local_40;
  double local_38;
  sbpl_2Dcell_t local_20;
  double local_18;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *local_10;
  
  local_18 = in_XMM0_Qa;
  local_10 = in_RSI;
  sVar10 = std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::size(in_RDI);
  if (sVar10 < 2) {
    sbpl_2Dcell_t::sbpl_2Dcell_t(&local_20);
    if (in_stack_00000008 < 0.0) {
      local_1bc = (int)(in_stack_00000008 / local_18) + -1;
    }
    else {
      local_1bc = (int)(in_stack_00000008 / local_18);
    }
    local_20.x = local_1bc;
    if (in_stack_00000010 < 0.0) {
      local_1c0 = (int)(in_stack_00000010 / local_18) + -1;
    }
    else {
      local_1c0 = (int)(in_stack_00000010 / local_18);
    }
    local_20.y = local_1c0;
    std::set<sbpl_2Dcell_t,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_>::insert
              (in_stack_fffffffffffffd60,
               (value_type *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  }
  else {
    local_38 = cos(in_stack_00000018);
    local_40 = sin(in_stack_00000018);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x1b2dfb);
    std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::size(in_RDI);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::reserve
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd68);
    local_68 = 1000000000;
    local_6c = -1000000000;
    local_70 = 1000000000;
    local_74 = -1000000000;
    local_78 = 0;
    while( true ) {
      uVar12 = (ulong)local_78;
      sVar10 = std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::size(in_RDI);
      if (sVar10 <= uVar12) break;
      std::pair<int,_int>::pair<int,_int,_true>(&local_80);
      dVar7 = local_38;
      pvVar11 = std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::operator[]
                          (in_RDI,(ulong)local_78);
      dVar5 = local_40;
      dVar1 = pvVar11->x;
      pvVar11 = std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::operator[]
                          (in_RDI,(ulong)local_78);
      dVar6 = local_40;
      local_88 = dVar7 * dVar1 + -(dVar5 * pvVar11->y) + in_stack_00000008;
      pvVar11 = std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::operator[]
                          (in_RDI,(ulong)local_78);
      dVar5 = local_38;
      dVar1 = pvVar11->x;
      pvVar11 = std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::operator[]
                          (in_RDI,(ulong)local_78);
      local_90 = dVar6 * dVar1 + dVar5 * pvVar11->y + in_stack_00000010;
      if (local_88 <= 0.0) {
        local_208 = local_88 / local_18 - 0.5;
      }
      else {
        local_208 = local_88 / local_18 + 0.5;
      }
      local_80.first = (int)local_208;
      if (local_90 <= 0.0) {
        local_210 = local_90 / local_18 - 0.5;
      }
      else {
        local_210 = local_90 / local_18 + 0.5;
      }
      local_80.second = (int)local_210;
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      if (local_80.first < local_68) {
        local_68 = local_80.first;
      }
      if (local_6c < local_80.first) {
        local_6c = local_80.first;
      }
      if (local_80.second < local_70) {
        local_70 = local_80.second;
      }
      if (local_74 < local_80.second) {
        local_74 = local_80.second;
      }
      local_78 = local_78 + 1;
    }
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::front
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    local_94 = (local_6c - local_68) + 3;
    local_98 = (local_74 - local_70) + 3;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)local_94;
    uVar12 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar12 = 0xffffffffffffffff;
    }
    local_a0 = (set<sbpl_2Dcell_t,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_> *)
               operator_new__(uVar12);
    for (local_a4 = 0; local_a4 < local_94; local_a4 = local_a4 + 1) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (long)local_98;
      uVar12 = SUB168(auVar3 * ZEXT816(4),0);
      if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
        uVar12 = 0xffffffffffffffff;
      }
      pvVar13 = operator_new__(uVar12);
      *(void **)((long)&(local_a0->_M_t)._M_impl.field_0x0 + (long)local_a4 * 8) = pvVar13;
      for (local_a8 = 0; local_a8 < local_98; local_a8 = local_a8 + 1) {
        *(undefined4 *)
         (*(long *)((long)&(local_a0->_M_t)._M_impl.field_0x0 + (long)local_a4 * 8) +
         (long)local_a8 * 4) = 0;
      }
    }
    local_ac = 1;
    while( true ) {
      uVar12 = (ulong)local_ac;
      sVar10 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                         (&local_58);
      if (sVar10 <= uVar12) break;
      pvVar14 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                          (&local_58,(ulong)(local_ac - 1));
      local_b0 = (pvVar14->first - local_68) + 1;
      pvVar14 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                          (&local_58,(ulong)(local_ac - 1));
      local_b4 = (pvVar14->second - local_70) + 1;
      pvVar14 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                          (&local_58,(ulong)local_ac);
      local_b8 = (pvVar14->first - local_68) + 1;
      pvVar14 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                          (&local_58,(ulong)local_ac);
      iVar4 = local_b0;
      iVar8 = (pvVar14->second - local_70) + 1;
      iVar9 = iVar8 - local_b4;
      if (iVar9 < 1) {
        iVar9 = -iVar9;
      }
      iVar15 = local_b8 - local_b0;
      if (iVar15 < 1) {
        iVar15 = -iVar15;
      }
      local_bd = iVar15 < iVar9;
      local_bc = iVar8;
      if ((bool)local_bd) {
        local_b0 = local_b4;
        local_b4 = iVar4;
        local_c4 = local_b8;
        local_bc = local_b8;
        local_b8 = iVar8;
      }
      iVar4 = local_b0;
      iVar9 = local_b4;
      if (local_b8 < local_b0) {
        local_b0 = local_b8;
        local_b8 = iVar4;
        local_c8 = local_b4;
        local_b4 = local_bc;
        local_bc = iVar9;
      }
      local_cc = local_b8 - local_b0;
      local_d0 = local_bc - local_b4;
      if (local_d0 < 1) {
        local_d0 = -local_d0;
      }
      local_d4 = local_cc / 2;
      local_d8 = -1;
      if (local_b4 < local_bc) {
        local_d8 = 1;
      }
      local_dc = local_b4;
      for (local_e0 = local_b0; local_e0 <= local_b8; local_e0 = local_e0 + 1) {
        if ((local_bd & 1) == 0) {
          *(undefined4 *)
           (*(long *)((long)&(local_a0->_M_t)._M_impl.field_0x0 + (long)local_e0 * 8) +
           (long)local_dc * 4) = 1;
          sbpl_2Dcell_t::sbpl_2Dcell_t(&local_100,local_e0 + -1 + local_68,local_dc + -1 + local_70)
          ;
          pVar16 = std::set<sbpl_2Dcell_t,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_>
                   ::insert(in_stack_fffffffffffffd60,
                            (value_type *)
                            CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
          local_110 = (_Base_ptr)pVar16.first._M_node;
          local_108 = pVar16.second;
        }
        else {
          *(undefined4 *)
           (*(long *)((long)&(local_a0->_M_t)._M_impl.field_0x0 + (long)local_dc * 8) +
           (long)local_e0 * 4) = 1;
          sbpl_2Dcell_t::sbpl_2Dcell_t(&local_e8,local_dc + -1 + local_68,local_e0 + -1 + local_70);
          pVar16 = std::set<sbpl_2Dcell_t,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_>
                   ::insert(in_stack_fffffffffffffd60,
                            (value_type *)
                            CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
          local_f8 = (_Base_ptr)pVar16.first._M_node;
          local_f0 = pVar16.second;
        }
        local_114 = local_d4;
        iVar9 = local_d4 - local_d0;
        if ((iVar9 < 0) && (local_e0 != local_b8)) {
          local_118 = local_dc;
          local_11c = local_e0;
          if (local_d4 < -iVar9) {
            local_118 = local_d8 + local_dc;
          }
          else {
            local_11c = local_e0 + 1;
          }
          local_d4 = iVar9;
          if ((local_bd & 1) == 0) {
            *(undefined4 *)
             (*(long *)((long)&(local_a0->_M_t)._M_impl.field_0x0 + (long)local_11c * 8) +
             (long)local_118 * 4) = 1;
            sbpl_2Dcell_t::sbpl_2Dcell_t
                      (&local_140,local_11c + -1 + local_68,local_118 + -1 + local_70);
            pVar16 = std::
                     set<sbpl_2Dcell_t,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_>::
                     insert(in_stack_fffffffffffffd60,
                            (value_type *)
                            CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
            local_150 = (_Base_ptr)pVar16.first._M_node;
            in_stack_fffffffffffffd77 = pVar16.second;
            local_148 = in_stack_fffffffffffffd77;
          }
          else {
            *(undefined4 *)
             (*(long *)((long)&(local_a0->_M_t)._M_impl.field_0x0 + (long)local_118 * 8) +
             (long)local_11c * 4) = 1;
            sbpl_2Dcell_t::sbpl_2Dcell_t
                      (&local_124,local_118 + -1 + local_68,local_11c + -1 + local_70);
            pVar16 = std::
                     set<sbpl_2Dcell_t,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_>::
                     insert(in_stack_fffffffffffffd60,
                            (value_type *)
                            CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
            local_138 = (_Base_ptr)pVar16.first._M_node;
            local_130 = pVar16.second;
          }
          local_dc = local_d8 + local_dc;
          iVar9 = local_cc + local_d4;
        }
        local_d4 = iVar9;
      }
      local_ac = local_ac + 1;
    }
    sbpl_bfs_2d::sbpl_bfs_2d
              ((sbpl_bfs_2d *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               (uint)(in_stack_fffffffffffffd68 >> 0x20),(uint)in_stack_fffffffffffffd68,
               (int)((ulong)in_stack_fffffffffffffd60 >> 0x20),(int)in_stack_fffffffffffffd60);
    sbpl_bfs_2d::compute_distance_from_point
              ((sbpl_bfs_2d *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
               (int **)in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20),
               (int)in_stack_fffffffffffffd48);
    for (local_184 = 0; local_184 < local_94; local_184 = local_184 + 1) {
      pvVar13 = *(void **)(&(local_a0->_M_t)._M_impl.field_0x0 + (long)local_184 * 8);
      if (pvVar13 != (void *)0x0) {
        operator_delete__(pvVar13);
      }
    }
    this = local_a0;
    if (local_a0 !=
        (set<sbpl_2Dcell_t,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_> *)0x0) {
      operator_delete__(local_a0);
    }
    for (local_188 = 1; (int)local_188 < local_94 + -1; local_188 = local_188 + 1) {
      for (local_18c = 1; (int)local_18c < local_98 + -1; local_18c = local_18c + 1) {
        iVar9 = sbpl_bfs_2d::get_distance(&local_180,local_188,local_18c);
        if (iVar9 < 0) {
          in_stack_fffffffffffffd50 = local_10;
          sbpl_2Dcell_t::sbpl_2Dcell_t
                    (&local_194,(local_188 - 1) + local_68,(local_18c - 1) + local_70);
          std::set<sbpl_2Dcell_t,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_>::insert
                    (this,(value_type *)CONCAT44(iVar9,in_stack_fffffffffffffd58));
        }
      }
    }
    sbpl_bfs_2d::~sbpl_bfs_2d
              ((sbpl_bfs_2d *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
              (in_stack_fffffffffffffd50);
  }
  return;
}

Assistant:

void get_2d_footprint_cells(vector<sbpl_2Dpt_t> polygon, set<sbpl_2Dcell_t>* cells, sbpl_xy_theta_pt_t pose, double res)
{
    //special case for point robot
    if (polygon.size() <= 1) {
        sbpl_2Dcell_t cell;
        cell.x = CONTXY2DISC(pose.x, res);
        cell.y = CONTXY2DISC(pose.y, res);

        cells->insert(cell);
        return;
    }

    //run bressenham line algorithm around the polygon (add them to the cells set)
    //while doing that find the min and max (x,y) and the average x and y
    double cth = cos(pose.theta);
    double sth = sin(pose.theta);

    vector<pair<int, int> > disc_polygon;
    disc_polygon.reserve(polygon.size() + 1);
    int minx = INFINITECOST;
    int maxx = -INFINITECOST;
    int miny = INFINITECOST;
    int maxy = -INFINITECOST;

    //find the bounding box of the polygon
    for (unsigned int i = 0; i < polygon.size(); i++) {
        pair<int, int> p;
        //		p.first = CONTXY2DISC(cth*polygon[i].x - sth*polygon[i].y + pose.x, res);
        double cx = (cth * polygon[i].x - sth * polygon[i].y + pose.x);
        double cy = (sth * polygon[i].x + cth * polygon[i].y + pose.y);
        p.first = (int)(cx > 0 ? cx / res + 0.5 : cx / res - 0.5); //(int)(cx / res + 0.5 * sign(c);
        //		p.second = CONTXY2DISC(sth*polygon[i].x + cth*polygon[i].y + pose.y, res);
        p.second = (int)(cy > 0 ? cy / res + 0.5 : cy / res - 0.5);//(int)(cy / res + 0.5);
        disc_polygon.push_back(p);
        if (p.first < minx) minx = p.first;
        if (p.first > maxx) maxx = p.first;
        if (p.second < miny) miny = p.second;
        if (p.second > maxy) maxy = p.second;
    }
    disc_polygon.push_back(disc_polygon.front());

    //make a grid big enough for the footprint
    int sizex = (maxx - minx + 1) + 2;
    int sizey = (maxy - miny + 1) + 2;
    int** grid = new int*[sizex];
    for (int i = 0; i < sizex; i++) {
        grid[i] = new int[sizey];
        for (int j = 0; j < sizey; j++)
            grid[i][j] = 0;
    }

    //plot line points on the grid
    for (unsigned int i = 1; i < disc_polygon.size(); i++) {
        int x0 = disc_polygon[i - 1].first - minx + 1;
        int y0 = disc_polygon[i - 1].second - miny + 1;
        int x1 = disc_polygon[i].first - minx + 1;
        int y1 = disc_polygon[i].second - miny + 1;

        //bressenham (add the line cells to the set and to a vector)
        bool steep = abs(y1 - y0) > abs(x1 - x0);
        if (steep) {
            int temp = x0;
            x0 = y0;
            y0 = temp;
            temp = x1;
            x1 = y1;
            y1 = temp;
        }
        if (x0 > x1) {
            int temp = x0;
            x0 = x1;
            x1 = temp;
            temp = y0;
            y0 = y1;
            y1 = temp;
        }
        int deltax = x1 - x0;
        int deltay = abs(y1 - y0);
        int error = deltax / 2;
        int ystep = (y0 < y1 ? 1 : -1);
        int y = y0;
        for (int x = x0; x <= x1; x++) {
            if (steep) {
                grid[y][x] = 1;
                cells->insert(sbpl_2Dcell_t(y - 1 + minx, x - 1 + miny));
            }
            else {
                grid[x][y] = 1;
                cells->insert(sbpl_2Dcell_t(x - 1 + minx, y - 1 + miny));
            }
            int last_error = error;
            error -= deltay;
            if (error < 0 && x != x1) {
                //make sure we can't have a diagonal line (the 8-connected bfs will leak through)

                int tempy = y;
                int tempx = x;
                if (last_error < -error)
                    tempy += ystep;
                else
                    tempx += 1;
                if (steep) {
                    grid[tempy][tempx] = 1;
                    cells->insert(sbpl_2Dcell_t(tempy - 1 + minx, tempx - 1 + miny));
                }
                else {
                    grid[tempx][tempy] = 1;
                    cells->insert(sbpl_2Dcell_t(tempx - 1 + minx, tempy - 1 + miny));
                }

                y += ystep;
                error += deltax;
            }
        }
    }

    //run a 2d bfs from the average (x,y)
    sbpl_bfs_2d bfs(sizex, sizey, 1);
    bfs.compute_distance_from_point(grid, 0, 0);

    for (int i = 0; i < sizex; i++)
        delete[] grid[i];
    delete[] grid;

    //add all cells expanded to the cells set
    for (int i = 1; i < sizex - 1; i++) {
        for (int j = 1; j < sizey - 1; j++) {
            if (bfs.get_distance(i, j) < 0) cells->insert(sbpl_2Dcell_t(i - 1 + minx, j - 1 + miny));
        }
    }
}